

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O3

int * inform_black_box_parts
                (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,int *box,
                inform_error *err)

{
  size_t __size;
  long lVar1;
  _Bool _Var2;
  size_t i;
  long *plVar3;
  size_t sVar4;
  int *__ptr;
  int *b_00;
  long lVar5;
  int iVar6;
  size_t sVar7;
  size_t l_00;
  int *__dest;
  
  _Var2 = check_arguments(series,l,1,n,b,(size_t *)0x0,(size_t *)0x0,err);
  if (_Var2) {
    return (int *)0x0;
  }
  if (parts != (size_t *)0x0 && nparts != 0) {
    __size = l * 8;
    plVar3 = (long *)malloc(__size);
    memcpy(plVar3,parts,__size);
    qsort(plVar3,l,8,compare_ints);
    if (*plVar3 == 0) {
      if (1 < l) {
        sVar4 = 1;
        do {
          if (((int)plVar3[sVar4] - (int)plVar3[sVar4 - 1] & 0xfffffffeU) != 0) goto LAB_0010961d;
          sVar4 = sVar4 + 1;
        } while (l != sVar4);
      }
      lVar5 = plVar3[l - 1];
      free(plVar3);
      if (lVar5 + 1U == nparts) {
        __ptr = box;
        if ((box != (int *)0x0) ||
           (__ptr = (int *)malloc((n * 4 + 4) * nparts), __ptr != (int *)0x0)) {
          lVar5 = nparts * n;
          if (nparts == l) {
            memcpy(__ptr,series,lVar5 * 4);
            sVar4 = 0;
            do {
              __ptr[lVar5 + sVar4] = b[sVar4];
              sVar4 = sVar4 + 1;
            } while (nparts != sVar4);
            return __ptr;
          }
          plVar3 = (long *)malloc(__size);
          if (plVar3 != (long *)0x0) {
            if (l != 0) {
              memset(plVar3,0xff,__size);
            }
            sVar4 = 0;
            do {
              if (l == 0) {
                l_00 = 0;
LAB_001097e0:
                b_00 = (int *)malloc((n * 4 + 4) * l_00);
                if (b_00 == (int *)0x0) {
                  free(plVar3);
                  break;
                }
                __ptr[lVar5 + sVar4] = 1;
                if (l_00 != 0) {
                  iVar6 = 1;
                  sVar7 = 0;
                  __dest = b_00 + l_00;
                  do {
                    lVar1 = plVar3[sVar7];
                    iVar6 = iVar6 * b[lVar1];
                    b_00[sVar7] = b[lVar1];
                    __ptr[lVar5 + sVar4] = iVar6;
                    if (n != 0) {
                      memcpy(__dest,series + lVar1 * n,n * 4);
                    }
                    sVar7 = sVar7 + 1;
                    __dest = __dest + n;
                  } while (l_00 != sVar7);
                }
                inform_black_box(b_00 + l_00,l_00,1,n,b_00,(size_t *)0x0,(size_t *)0x0,
                                 __ptr + sVar4 * n,err);
                free(b_00);
                _Var2 = inform_failed(err);
                if (_Var2) {
                  free(plVar3);
                  if (box != (int *)0x0) {
                    return (int *)0x0;
                  }
                  free(__ptr);
                  return (int *)0x0;
                }
                if (l != 0) goto LAB_001098ef;
              }
              else {
                sVar7 = 0;
                l_00 = 0;
                do {
                  if (parts[sVar7] == sVar4) {
                    plVar3[l_00] = sVar7;
                    l_00 = l_00 + 1;
                  }
                  sVar7 = sVar7 + 1;
                } while (l != sVar7);
                if (l_00 != 1) goto LAB_001097e0;
                lVar1 = *plVar3;
                memcpy(__ptr + sVar4 * n,series + lVar1 * n,n * 4);
                __ptr[lVar5 + sVar4] = b[lVar1];
LAB_001098ef:
                memset(plVar3,0xff,__size);
              }
              sVar4 = sVar4 + 1;
              if (sVar4 == nparts) {
                free(plVar3);
                return __ptr;
              }
            } while( true );
          }
          if (box == (int *)0x0) {
            free(__ptr);
          }
        }
        if (err == (inform_error *)0x0) {
          return (int *)0x0;
        }
        *err = INFORM_ENOMEM;
        return (int *)0x0;
      }
    }
    else {
LAB_0010961d:
      free(plVar3);
    }
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_EPARTS;
  }
  return (int *)0x0;
}

Assistant:

int *inform_black_box_parts(int const *series, size_t l, size_t n, int const *b,
    size_t const *parts, size_t nparts, int *box, inform_error *err)
{
    if (check_arguments(series, l, 1, n, b, NULL, NULL, err))
    {
        return NULL;
    }
    if (parts == NULL || nparts < 1)
    {
        INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
    }
    else
    {
        size_t *sorted_parts = malloc(l * sizeof(size_t));
        memcpy(sorted_parts, parts, l * sizeof(size_t));
        qsort(sorted_parts, l, sizeof(size_t), compare_ints);
        if (sorted_parts[0] != 0)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        for (size_t i = 1; i < l; ++i)
        {
            int x = (int)(sorted_parts[i] - sorted_parts[i-1]);
            if (x != 0 && x != 1)
            {
                free(sorted_parts);
                INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
            }
        }
        if (sorted_parts[l-1] + 1 != nparts)
        {
            free(sorted_parts);
            INFORM_ERROR_RETURN(err, INFORM_EPARTS, NULL);
        }
        free(sorted_parts);
    }

    int allocate = (box == NULL);
    if (allocate)
    {
        box = malloc(nparts * (1 + n) * sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    int *partitioned = box;
    int *bases = partitioned + nparts * n;
    if (nparts == l)
    {
        memcpy(partitioned, series, l * n * sizeof(int));
        for (size_t i = 0; i < l; ++i) bases[i] = b[i];
    }
    else
    {
        size_t *members = malloc(l * sizeof(size_t));
        if (members == NULL)
        {
            if (allocate) free(box);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) members[i] = -1;

        for (size_t i = 0; i < nparts; ++i)
        {
            size_t k = 0;
            for (size_t j = 0; j < l; ++j)
            {
                if (parts[j] == i)
                {
                    members[k++] = j;
                }
            }

            if (k == 1)
            {
                memcpy(partitioned + n*i, series + n*members[0], n*sizeof(int));
                bases[i] = b[members[0]];
            }
            else
            {
                int *subbases = malloc(k * (1 + n) * sizeof(int));
                int *subseries = subbases + k;
                if (subseries == NULL)
                {
                    free(members);
                    if (allocate) free(box);
                    INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
                }
                bases[i] = 1;
                for (size_t j = 0; j < k; ++j)
                {
                    subbases[j] = b[members[j]];
                    bases[i] *= subbases[j];
                    for (size_t p = 0; p < n; ++p)
                    {
                        subseries[p + n*j] = series[p + n*members[j]];
                    }
                }
                inform_black_box(subseries, k, 1, n, subbases, NULL, NULL,
                    partitioned + n*i, err);
                free(subbases);
                if (inform_failed(err))
                {
                    free(members);
                    if (allocate) free(box);
                    return NULL;
                }
            }
            for (size_t i = 0; i < l; ++i) members[i] = -1;
        }
        free(members);
    }
    return box;
}